

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

int Sfm_LibFindDelayMatches
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Ptr_t *vGates,Vec_Ptr_t *vFans
              )

{
  uint nWords;
  int w;
  int iVar1;
  long lVar2;
  int *piVar3;
  int nWords_00;
  int Addition;
  Mio_Cell2_t *pMVar4;
  void *Entry;
  char *Entry_00;
  Sfm_Fun_t *pSVar5;
  word pCopy [4];
  
  if (6 < nFanins) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      pCopy[lVar2] = pTruth[lVar2];
    }
    Dau_DsdPrintFromTruth(pCopy,p->nVars);
  }
  vGates->nSize = 0;
  vFans->nSize = 0;
  nWords = p->nWords;
  iVar1 = Abc_TtIsConst0(pTruth,nWords);
  if (iVar1 == 0) {
    iVar1 = Abc_TtIsConst1(pTruth,nWords);
    if (iVar1 == 0) {
      iVar1 = Abc_TtEqual(pTruth,s_Truth8[0],nWords);
      if (iVar1 == 0) {
        iVar1 = Abc_TtOpposite(pTruth,(word *)(ulong)nWords,nWords_00);
        if (iVar1 == 0) {
          piVar3 = Vec_MemHashLookup(p->vTtMem,pTruth);
          iVar1 = *piVar3;
          if (iVar1 == -1) {
            if ((6 < nFanins) || (iVar1 = 0, p->fVerbose != 0)) {
              iVar1 = 0;
              printf("Not found in the precomputed library: ");
              Dau_DsdPrintFromTruth(pTruth,nFanins);
            }
          }
          else {
            Vec_IntAddToEntry(&p->vHits,iVar1,Addition);
            iVar1 = Vec_IntEntry(&p->vLists,iVar1);
            if (iVar1 == -1) {
              pSVar5 = (Sfm_Fun_t *)0x0;
            }
            else {
              pSVar5 = p->pObjs + iVar1;
            }
            while (pSVar5 != (Sfm_Fun_t *)0x0) {
              pMVar4 = p->pCells + pSVar5->pFansT[0];
              Vec_PtrPush(vGates,p->pCells[pSVar5->pFansB[0]].pMioGate);
              if (pMVar4 == p->pCells) {
                Entry = (void *)0x0;
              }
              else {
                Entry = pMVar4->pMioGate;
              }
              Vec_PtrPush(vGates,Entry);
              Vec_PtrPush(vFans,pSVar5->pFansB + 1);
              Entry_00 = pSVar5->pFansT + 1;
              if (pMVar4 == p->pCells) {
                Entry_00 = (char *)0x0;
              }
              Vec_PtrPush(vFans,Entry_00);
              piVar3 = &pSVar5->Next;
              pSVar5 = (Sfm_Fun_t *)0x0;
              if ((long)*piVar3 != -1) {
                pSVar5 = p->pObjs + *piVar3;
              }
            }
            iVar1 = vGates->nSize / 2;
          }
          return iVar1;
        }
      }
    }
  }
  __assert_fail("!Abc_TtIsConst0(pTruth, p->nWords) && !Abc_TtIsConst1(pTruth, p->nWords) && !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                ,0x275,
                "int Sfm_LibFindDelayMatches(Sfm_Lib_t *, word *, int *, int, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

int Sfm_LibFindDelayMatches( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Ptr_t * vGates, Vec_Ptr_t * vFans )
{
    Sfm_Fun_t * pObj;
    Mio_Cell2_t * pCellB, * pCellT;
    int iFunc;
    if ( nFanins > 6 )
    {
        word pCopy[4];
        Abc_TtCopy( pCopy, pTruth, 4, 0 );
        Dau_DsdPrintFromTruth( pCopy, p->nVars );
    }
    Vec_PtrClear( vGates );
    Vec_PtrClear( vFans );
    // look for gate
    assert( !Abc_TtIsConst0(pTruth, p->nWords) && 
            !Abc_TtIsConst1(pTruth, p->nWords) && 
            !Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) && 
            !Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) );
    iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
    {
        // print functions not found in the library
        if ( p->fVerbose || nFanins > 6 )
        {
            printf( "Not found in the precomputed library: " );
            Dau_DsdPrintFromTruth( pTruth, nFanins );
        }
        return 0;
    }
    Vec_IntAddToEntry( &p->vHits, iFunc, 1 );
    // collect matches
    Sfm_LibForEachSuper( p, pObj, iFunc )
    {
        pCellB = p->pCells + (int)pObj->pFansB[0];
        pCellT = p->pCells + (int)pObj->pFansT[0];
        Vec_PtrPush( vGates, pCellB->pMioGate );
        Vec_PtrPush( vGates, pCellT == p->pCells ? NULL : pCellT->pMioGate );
        Vec_PtrPush( vFans, pObj->pFansB + 1 );
        Vec_PtrPush( vFans, pCellT == p->pCells ? NULL : pObj->pFansT + 1 );
    }
    return Vec_PtrSize(vGates) / 2;
}